

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteDeltaFor
               (long *values,bool *validity,bitpacking_width_t width,long frame_of_reference,
               long delta_offset,long *original_values,idx_t count,void *data_ptr)

{
  long *plVar1;
  idx_t iVar2;
  undefined7 in_register_00000011;
  
  iVar2 = BitpackingPrimitives::GetRequiredSize(count,width);
  ReserveSpace((BitpackingCompressionState<long,_true,_long> *)data_ptr,iVar2 + 0x18);
  WriteMetaData((BitpackingCompressionState<long,_true,_long> *)data_ptr,DELTA_FOR);
  plVar1 = *(long **)((long)data_ptr + 0x40);
  *plVar1 = frame_of_reference;
  plVar1[1] = CONCAT71(in_register_00000011,width) & 0xffffffff;
  plVar1[2] = delta_offset;
  *(long **)((long)data_ptr + 0x40) = plVar1 + 3;
  BitpackingPrimitives::PackBuffer<long,false>((data_ptr_t)(plVar1 + 3),values,count,width);
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + iVar2;
  UpdateStats((BitpackingCompressionState<long,_true,_long> *)data_ptr,count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}